

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

reference<mpt::layout::graph::transform3> * __thiscall
mpt::reference<mpt::layout::graph::transform3>::operator=
          (reference<mpt::layout::graph::transform3> *this,
          reference<mpt::layout::graph::transform3> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  transform3 *this_00;
  transform3 *ptVar2;
  
  ptVar2 = ref->_ref;
  this_00 = this->_ref;
  if (ptVar2 != this_00) {
    if (ptVar2 == (transform3 *)0x0) {
      ptVar2 = (transform3 *)0x0;
    }
    else {
      iVar1 = refcount::raise(&(ptVar2->super_type)._ref,(int)ref);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        ptVar2 = (transform3 *)0x0;
      }
      this_00 = this->_ref;
    }
    if (this_00 != (transform3 *)0x0) {
      reference<mpt::transform>::type::unref(&this_00->super_type);
    }
    this->_ref = ptVar2;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}